

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void mul(int64_t *o,int64_t *a,int64_t *b)

{
  ulong local_140;
  size_t i_3;
  size_t i_2;
  size_t j;
  size_t i_1;
  size_t i;
  int64_t t [31];
  int64_t *b_local;
  int64_t *a_local;
  int64_t *o_local;
  
  for (i_1 = 0; i_1 < 0x1f; i_1 = i_1 + 1) {
    t[i_1 - 1] = 0;
  }
  for (j = 0; j < 0x10; j = j + 1) {
    for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
      t[j + i_2 + -1] = a[j] * b[i_2] + t[j + i_2 + -1];
    }
  }
  for (i_3 = 0; i_3 < 0xf; i_3 = i_3 + 1) {
    t[i_3 - 1] = t[i_3 + 0xf] * 0x26 + t[i_3 - 1];
  }
  for (local_140 = 0; local_140 < 0x10; local_140 = local_140 + 1) {
    o[local_140] = t[local_140 - 1];
  }
  t[0x1e] = (int64_t)b;
  car25519(o);
  car25519(o);
  return;
}

Assistant:

static void mul(gf o, const gf a, const gf b)
{
  int64_t t[31];

  for (size_t i = 0; i < 31; i++)
    t[i] = 0;

  for (size_t i = 0; i < 16; i++)
    for (size_t j = 0; j < 16; j++)
      t[i + j] += a[i] * b[j];

  for (size_t i = 0; i < 15; i++)
    t[i] += 38 * t[i + 16];

  for (size_t i = 0; i < 16; i++)
    o[i] = t[i];

  car25519(o);
  car25519(o);
}